

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  uint uVar1;
  void *output;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  undefined8 uVar6;
  REF_STATUS RVar7;
  char *pcVar8;
  REF_DBL log_total;
  REF_DBL max;
  REF_DBL min;
  
  iVar5 = ref_histogram->nbin;
  if ((long)iVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x79,"ref_histogram_gather","malloc bins of REF_INT negative");
    RVar7 = 1;
  }
  else {
    output = malloc((long)iVar5 * 4);
    if (output == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x79,"ref_histogram_gather","malloc bins of REF_INT NULL");
      RVar7 = 2;
    }
    else {
      uVar1 = ref_mpi_sum(ref_mpi,ref_histogram->bins,output,iVar5,1);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_max(ref_mpi,ref_histogram,&max,3);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_min(ref_mpi,&ref_histogram->min,&min,3);
          if (uVar1 == 0) {
            uVar1 = ref_mpi_sum(ref_mpi,&ref_histogram->log_total,&log_total,1,3);
            if (uVar1 == 0) {
              if (ref_mpi->id == 0) {
                ref_histogram->max = max;
                ref_histogram->min = min;
                ref_histogram->log_total = log_total;
                for (lVar2 = 0; uVar1 = ref_histogram->nbin, lVar2 < (int)uVar1; lVar2 = lVar2 + 1)
                {
                  ref_histogram->bins[lVar2] = *(REF_INT *)((long)output + lVar2 * 4);
                }
                uVar4 = 0;
                uVar3 = (ulong)uVar1;
                if ((int)uVar1 < 1) {
                  uVar3 = uVar4;
                }
                iVar5 = 0;
                for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
                  iVar5 = iVar5 + ref_histogram->bins[uVar4];
                }
                ref_histogram->log_mean = 0.0;
                if (0 < iVar5) {
                  ref_histogram->log_mean = log_total / (double)iVar5;
                }
              }
              else {
                ref_histogram->max = -1e+20;
                ref_histogram->min = 1e+20;
                ref_histogram->log_total = 0.0;
                for (lVar2 = 0; lVar2 < ref_histogram->nbin; lVar2 = lVar2 + 1) {
                  ref_histogram->bins[lVar2] = 0;
                }
                ref_histogram->log_mean = 0.0;
              }
              uVar1 = ref_mpi_bcast(ref_mpi,&ref_histogram->log_mean,1,3);
              if (uVar1 == 0) {
                free(output);
                return 0;
              }
              uVar3 = (ulong)uVar1;
              pcVar8 = "log_mean";
              uVar6 = 0x9f;
            }
            else {
              uVar3 = (ulong)uVar1;
              pcVar8 = "log_total";
              uVar6 = 0x86;
            }
          }
          else {
            uVar3 = (ulong)uVar1;
            pcVar8 = "min";
            uVar6 = 0x83;
          }
        }
        else {
          uVar3 = (ulong)uVar1;
          pcVar8 = "max";
          uVar6 = 0x80;
        }
      }
      else {
        uVar3 = (ulong)uVar1;
        pcVar8 = "sum";
        uVar6 = 0x7d;
      }
      RVar7 = (REF_STATUS)uVar3;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             uVar6,"ref_histogram_gather",uVar3,pcVar8);
    }
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather(REF_HISTOGRAM ref_histogram,
                                        REF_MPI ref_mpi) {
  REF_INT *bins;
  REF_DBL min, max, log_total;
  REF_INT i, observations;

  ref_malloc(bins, ref_histogram_nbin(ref_histogram), REF_INT);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->bins, bins,
                  ref_histogram_nbin(ref_histogram), REF_INT_TYPE),
      "sum");
  RSS(ref_mpi_max(ref_mpi, &ref_histogram_max(ref_histogram), &max,
                  REF_DBL_TYPE),
      "max");
  RSS(ref_mpi_min(ref_mpi, &ref_histogram_min(ref_histogram), &min,
                  REF_DBL_TYPE),
      "min");
  RSS(ref_mpi_sum(ref_mpi, &ref_histogram_log_total(ref_histogram), &log_total,
                  1, REF_DBL_TYPE),
      "log_total");

  if (ref_mpi_once(ref_mpi)) {
    ref_histogram_max(ref_histogram) = max;
    ref_histogram_min(ref_histogram) = min;
    ref_histogram_log_total(ref_histogram) = log_total;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = bins[i];
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    ref_histogram_log_mean(ref_histogram) = 0.0;
    if (observations > 0)
      ref_histogram_log_mean(ref_histogram) = log_total / (REF_DBL)observations;
  } else {
    ref_histogram_max(ref_histogram) = -1.0e20;
    ref_histogram_min(ref_histogram) = 1.0e20;
    ref_histogram_log_total(ref_histogram) = 0.0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      ref_histogram->bins[i] = 0;
    ref_histogram_log_mean(ref_histogram) = 0.0;
  }

  RSS(ref_mpi_bcast(ref_mpi, &ref_histogram_log_mean(ref_histogram), 1,
                    REF_DBL_TYPE),
      "log_mean");

  ref_free(bins);

  return REF_SUCCESS;
}